

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio.h
# Opt level: O1

ssize_t __thiscall
lossless_neural_sound::audio::File_input_stream::read
          (File_input_stream *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined1 uVar1;
  int iVar2;
  void *pvVar3;
  undefined4 in_register_00000034;
  
  if (__buf == (void *)0x0) {
    __buf = (void *)0x0;
  }
  else {
    pvVar3 = (void *)0x0;
    do {
      iVar2 = std::istream::peek();
      if (iVar2 == -1) {
        return (ssize_t)pvVar3;
      }
      uVar1 = std::istream::get();
      *(undefined1 *)(CONCAT44(in_register_00000034,__fd) + (long)pvVar3) = uVar1;
      pvVar3 = (void *)((long)pvVar3 + 1);
    } while (__buf != pvVar3);
  }
  return (ssize_t)__buf;
}

Assistant:

virtual std::size_t read(unsigned char *buffer, std::size_t buffer_size) override
    {
        std::size_t retval = 0;
        while(buffer_size > 0 && is.peek() != std::char_traits<char>::eof())
        {
            *buffer++ = is.get();
            buffer_size--;
            retval++;
        }
        return retval;
    }